

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O3

double Js::DateImplementation::DateFncUTC(ScriptContext *scriptContext,Arguments *args)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var aValue;
  ulong uVar4;
  double dVar5;
  double adStack_80 [9];
  ScriptContext *local_38;
  
  if (((ulong)args->Info & 0xfffffe) != 0) {
    local_38 = scriptContext;
    if ((SUB84(args->Info,0) & 0xffffff) != 1) {
      adStack_80[0] = 5.82469651763219e-317;
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar4 = 1;
      do {
        adStack_80[0] = 5.82470343455123e-317;
        aValue = Arguments::operator[](args,(int)uVar4);
        if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
            ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
          if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) goto LAB_00b3e48b;
          if ((ulong)aValue >> 0x32 == 0) {
            adStack_80[0] = 5.82481558745283e-317;
            dVar5 = JavascriptConversion::ToNumber_Full(aValue,local_38);
          }
          else {
            dVar5 = (double)((ulong)aValue ^ 0xfffc000000000000);
          }
        }
        else {
          AssertCount = AssertCount + 1;
          adStack_80[0] = 5.82473406662127e-317;
          Throw::LogAssert();
          *puVar3 = 1;
          adStack_80[0] = 5.82475333518146e-317;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
LAB_00b3e48b:
          dVar5 = (double)(int)aValue;
        }
        adStack_80[uVar4] = dVar5;
      } while ((uVar4 - 1 < 6) &&
              (bVar2 = uVar4 < (*(uint *)&args->Info & 0xffffff) - 1, uVar4 = uVar4 + 1, bVar2));
    }
    uVar4 = 0;
    do {
      if (uVar4 < (*(uint *)&args->Info & 0xffffff) - 1) {
        local_38 = (ScriptContext *)adStack_80[uVar4 + 1];
        adStack_80[0] = 5.82456213177652e-317;
        bVar2 = NumberUtilities::IsFinite((double)local_38);
        if (!bVar2) {
          return NAN;
        }
        adStack_80[0] = 5.82457102495814e-317;
        dVar5 = ConvertToInteger((double)local_38);
      }
      else {
        dVar5 = 1.0;
        if (uVar4 != 2) {
          dVar5 = 0.0;
        }
      }
      adStack_80[uVar4 + 1] = dVar5;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 7);
    adStack_80[0] = 5.82465699238052e-317;
    dVar5 = DateUtilities::TvFromDate
                      ((double)(~-(ulong)(adStack_80[1] < 100.0) & (ulong)adStack_80[1] |
                               (~-(ulong)(0.0 <= adStack_80[1]) & (ulong)adStack_80[1] |
                               (ulong)(adStack_80[1] + 1900.0) & -(ulong)(0.0 <= adStack_80[1])) &
                               -(ulong)(adStack_80[1] < 100.0)),adStack_80[2],adStack_80[3] + -1.0,
                       adStack_80[6] * 1000.0 + adStack_80[4] * 3600000.0 + adStack_80[5] * 60000.0
                       + adStack_80[7]);
    if (ABS(dVar5) <= 8.64e+15) {
      return dVar5;
    }
  }
  return NAN;
}

Assistant:

double DateImplementation::DateFncUTC(ScriptContext* scriptContext, Arguments args)
    {
        const int kcvarMax = 7;
        double rgdbl[kcvarMax];
        double tv;
        double dblT;
        uint ivar;

        // See: https://github.com/Microsoft/ChakraCore/issues/1665
        // Date.UTC should return NaN with 0 arguments.
        // args.Info.Count includes an implicit first parameter, so we check for Count <= 1.
        if (args.Info.Count <= 1)
        {
            return JavascriptNumber::NaN;
        }

        for (ivar = 0; (ivar < (args.Info.Count-1)) && ivar < kcvarMax; ++ivar)
        {
            rgdbl[ivar] = JavascriptConversion::ToNumber(args[ivar+1],scriptContext);

        }
        for (ivar = 0; ivar < kcvarMax; ivar++)
        {
            // Unspecified parameters are treated like zero, except date, which
            // is treated as 1.
            if (ivar >= (args.Info.Count - 1))
            {
                rgdbl[ivar] = (ivar == 2);
                continue;
            }
#pragma prefast(suppress:6001, "rgdbl index ivar < args.Info.Count - 1 are initialized")
            dblT = rgdbl[ivar];
            if (!Js::NumberUtilities::IsFinite(dblT))
            {
                return JavascriptNumber::NaN;
            }
            rgdbl[ivar] = ConvertToInteger(dblT);
        }

        // adjust the year
        if (rgdbl[0] < 100 && rgdbl[0] >= 0)
        {
            rgdbl[0] += 1900;
        }

        // Get the UTC time value.
        tv = TvFromDate(rgdbl[0], rgdbl[1], rgdbl[2] - 1,
            rgdbl[3] * 3600000 + rgdbl[4] * 60000 + rgdbl[5] * 1000 + rgdbl[6]);

        if (tv < ktvMin || tv > ktvMax)
        {
            return JavascriptNumber::NaN;
        }
        else
        {
            return tv;
        }
    }